

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O0

void __thiscall JointActionDiscrete::~JointActionDiscrete(JointActionDiscrete *this)

{
  JointActionDiscrete *in_stack_00000010;
  
  ~JointActionDiscrete(in_stack_00000010);
  return;
}

Assistant:

JointActionDiscrete::~JointActionDiscrete()
{
if(DEBUG_JAD) cout << "deleting joint action";

/*  Do not delete the individual actions that are pointed to (there is only
 *  one copy of those, so that will lead to segfaults)
    for(Index i=0; i<_m_apVector.size(); i++) 
        delete _m_apVector[i];*/

    _m_apVector.clear();
}